

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_densities.c
# Opt level: O1

int inc_densities(float32 ***new_mixw,vector_t ***new_mean,vector_t ***new_var,
                 vector_t ****new_fullvar,float32 ***mixw,vector_t ***mean,vector_t ***var,
                 vector_t ****fullvar,float32 ***dnom,uint32 n_mixw,uint32 n_mgau,uint32 n_dnom,
                 uint32 n_feat,uint32 n_density,uint32 *veclen,uint32 n_inc)

{
  uint *puVar1;
  float32 *pfVar2;
  vector_t *ppfVar3;
  uint32 uVar4;
  void *pvVar5;
  vector_t ***ppppfVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  void *__src;
  vector_t pfVar15;
  vector_t pfVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  float fVar21;
  double local_48;
  
  if (n_mgau >= n_mixw && n_mgau != n_mixw) {
    __assert_fail("n_mgau <= n_mixw",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                  ,0x60,
                  "int inc_densities(float32 ***, vector_t ***, vector_t ***, vector_t ****, float32 ***, vector_t ***, vector_t ***, vector_t ****, float32 ***, uint32, uint32, uint32, uint32, uint32, const uint32 *, uint32)"
                 );
  }
  if (n_mgau < n_mixw) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
            ,99,"Splitting of the tied mixture gaussians is not yet implemented\n");
    exit(1);
  }
  if (n_mgau != 0) {
    uVar18 = 0;
    do {
      if (n_feat != 0) {
        uVar14 = 0;
        do {
          if (n_density != 0) {
            lVar13 = 0;
            do {
              memcpy(*(void **)((long)new_mean[uVar18][uVar14] + lVar13 * 2),
                     *(void **)((long)mean[uVar18][uVar14] + lVar13 * 2),(ulong)veclen[uVar14] << 2)
              ;
              if (fullvar == (vector_t ****)0x0) {
                pvVar5 = *(void **)((long)new_var[uVar18][uVar14] + lVar13 * 2);
                __src = *(void **)((long)var[uVar18][uVar14] + lVar13 * 2);
                uVar8 = veclen[uVar14];
              }
              else {
                pvVar5 = (void *)**(undefined8 **)((long)new_fullvar[uVar18][uVar14] + lVar13 * 2);
                __src = (void *)**(undefined8 **)((long)fullvar[uVar18][uVar14] + lVar13 * 2);
                uVar8 = veclen[uVar14] * veclen[uVar14];
              }
              memcpy(pvVar5,__src,(ulong)uVar8 << 2);
              *(undefined4 *)((long)new_mixw[uVar18][uVar14] + lVar13) =
                   *(undefined4 *)((long)mixw[uVar18][uVar14] + lVar13);
              lVar13 = lVar13 + 4;
            } while ((ulong)n_density * 4 - lVar13 != 0);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != n_feat);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != n_mgau);
  }
  pvVar5 = __ckd_calloc_2d__((ulong)n_feat,(ulong)n_inc,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                             ,0x80);
  if (n_mgau != 0) {
    uVar18 = 0;
    do {
      printf("%u:",uVar18 & 0xffffffff);
      fflush(_stdout);
      if (n_inc != 0) {
        uVar14 = 0;
        do {
          if (n_feat != 0) {
            uVar8 = (int)uVar14 + n_density;
            uVar19 = 0;
            do {
              uVar17 = (ulong)n_density;
              puVar1 = *(uint **)((long)pvVar5 + uVar19 * 8);
              puVar1[uVar14] = n_density;
              if (n_density == 0) {
                uVar4 = 0;
                local_48 = -1.0;
                uVar9 = 0;
              }
              else {
                uVar11 = 0;
                fVar21 = -1.0;
                do {
                  if (fVar21 < (float)dnom[uVar18][uVar19][uVar11]) {
                    bVar20 = uVar14 == 0;
                    if ((uVar14 != 0) && (uVar11 != *puVar1)) {
                      uVar7 = 1;
                      do {
                        uVar12 = uVar7;
                        if (uVar14 == uVar12) break;
                        uVar7 = uVar12 + 1;
                      } while (uVar11 != puVar1[uVar12]);
                      bVar20 = uVar14 <= uVar12;
                    }
                    if (bVar20) {
                      uVar17 = uVar11 & 0xffffffff;
                      fVar21 = (float)dnom[uVar18][uVar19][uVar11];
                    }
                  }
                  uVar9 = (uint)uVar17;
                  uVar11 = uVar11 + 1;
                } while (uVar11 != n_density);
                local_48 = (double)fVar21;
                uVar4 = n_density;
              }
              uVar17 = (ulong)uVar9;
              if (1.2e-38 < (float)dnom[uVar18][uVar19][uVar17] ||
                  (float)dnom[uVar18][uVar19][uVar17] == 1.2e-38) {
                pfVar2 = new_mixw[uVar18][uVar19];
                fVar21 = (float)pfVar2[uVar17];
                pfVar2[uVar17] = (float32)(fVar21 * 0.5);
                pfVar2[uVar8] = (float32)(fVar21 * 0.5);
                if (fullvar == (vector_t ****)0x0) {
                  pfVar16 = new_var[uVar18][uVar19][uVar8];
                  pfVar15 = var[uVar18][uVar19][uVar17];
                  uVar10 = veclen[uVar19];
                }
                else {
                  pfVar16 = *new_fullvar[uVar18][uVar19][uVar8];
                  pfVar15 = *fullvar[uVar18][uVar19][uVar17];
                  uVar10 = veclen[uVar19] * veclen[uVar19];
                }
                memcpy(pfVar16,pfVar15,(ulong)uVar10 << 2);
                if (veclen[uVar19] != 0) {
                  uVar11 = 0;
                  do {
                    ppppfVar6 = var + uVar18;
                    uVar7 = uVar19;
                    uVar12 = uVar17;
                    if (fullvar != (vector_t ****)0x0) {
                      ppppfVar6 = fullvar[uVar18] + uVar19;
                      uVar7 = uVar17;
                      uVar12 = uVar11;
                    }
                    fVar21 = (*ppppfVar6)[uVar7][uVar12][uVar11];
                    if (fVar21 < 0.0) {
                      fVar21 = sqrtf(fVar21);
                    }
                    else {
                      fVar21 = SQRT(fVar21);
                    }
                    pfVar16 = mean[uVar18][uVar19][uVar17];
                    ppfVar3 = new_mean[uVar18][uVar19];
                    ppfVar3[uVar17][uVar11] = fVar21 * 0.2 + pfVar16[uVar11];
                    ppfVar3[uVar8][uVar11] = fVar21 * -0.2 + pfVar16[uVar11];
                    uVar11 = uVar11 + 1;
                  } while (uVar11 < veclen[uVar19]);
                }
                *(uint *)(*(long *)((long)pvVar5 + uVar19 * 8) + uVar14 * 4) = uVar9;
                printf("%u(%.2e)",local_48);
                fflush(_stdout);
              }
              else {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                        ,0x94,"(mgau= %u, feat= %u, density= %u) never observed skipping\n",
                        uVar18 & 0xffffffff,uVar19 & 0xffffffff,uVar4);
                new_mixw[uVar18][uVar19][uVar8] = 0.0;
                if (fullvar == (vector_t ****)0x0) {
                  pfVar16 = new_var[uVar18][uVar19][uVar8];
                  pfVar15 = *var[uVar18][uVar19];
                  uVar9 = veclen[uVar19];
                }
                else {
                  pfVar16 = *new_fullvar[uVar18][uVar19][uVar8];
                  pfVar15 = **fullvar[uVar18][uVar19];
                  uVar9 = veclen[uVar19] * veclen[uVar19];
                }
                memcpy(pfVar16,pfVar15,(ulong)uVar9 << 2);
                memcpy(new_mean[uVar18][uVar19][uVar8],*mean[uVar18][uVar19],
                       (ulong)veclen[uVar19] << 2);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != n_feat);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != n_inc);
      }
      putchar(10);
      uVar18 = uVar18 + 1;
    } while (uVar18 != n_mgau);
  }
  return 0;
}

Assistant:

int
inc_densities(float32 ***new_mixw,
	      vector_t ***new_mean,
	      vector_t ***new_var,
	      vector_t ****new_fullvar,

	      float32 ***mixw,
	      vector_t ***mean,
	      vector_t ***var,
	      vector_t ****fullvar,
	      float32 ***dnom,
	      
	      uint32 n_mixw,
	      uint32 n_mgau,
	      uint32 n_dnom,
	      uint32 n_feat,
	      uint32 n_density,
	      const uint32 *veclen,
	      uint32 n_inc)
{
    uint32 i, j, k, l, r;
    uint32 **did;
    float32 max_wt;
    uint32 max_wt_idx;
    float32 std;

    assert(n_mgau <= n_mixw);
    
    if (n_mgau < n_mixw) {
	E_FATAL("Splitting of the tied mixture gaussians is not yet implemented\n");
    }

    /* copy old parameters into new arrays */
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		memcpy(new_mean[i][j][k], mean[i][j][k], veclen[j]*sizeof(float32));
		if (fullvar)
		    memcpy(new_fullvar[i][j][k][0], fullvar[i][j][k][0],
			   veclen[j]*veclen[j]*sizeof(float32));
		else
		    memcpy(new_var[i][j][k], var[i][j][k], veclen[j]*sizeof(float32));
		new_mixw[i][j][k] = mixw[i][j][k];
	    }
	}
    }

    /* Over all mixtures:
     * 	- Find the largest unsplit component density.
     *		- Split it into two components where the new component
     *			mixw_a = mixw_b = 1/2 mixw
     *			mean_a = mean + 0.2 std
     *			mean_b = mean - 0.2 std
     *			var_a = var_b = var
     *
     * New parameters are placed beginning at index n_density
     */

    did = (uint32 **)ckd_calloc_2d(n_feat, n_inc, sizeof(uint32));

    for (i = 0; i < n_mgau; i++) {
	printf("%u:", i);
	fflush(stdout);
	
	for (r = 0; r < n_inc; r++) {
	    for (j = 0; j < n_feat; j++) {
		did[j][r] = n_density;

		/* find the density w/ the largest EM count not yet split (i.e. most probable, most occurances) */
		for (k = 0, max_wt = -1.0, max_wt_idx = n_density; k < n_density; k++) {
		    if ((max_wt < dnom[i][j][k]) && not_done(k, did[j], r)) {
			max_wt = dnom[i][j][k];
			max_wt_idx = k;
		    }
		}

		if ( dnom[i][j][max_wt_idx] < MIN_IEEE_NORM_POS_FLOAT32 ) {
		    E_WARN("(mgau= %u, feat= %u, density= %u) never observed skipping\n",
			   i, j, k);

		    new_mixw[i][j][n_density+r] = 0;

		    if (fullvar)
			memcpy(new_fullvar[i][j][n_density+r][0], fullvar[i][j][0][0],
			       veclen[j]*veclen[j]*sizeof(float32));
		    else 
			memcpy(new_var[i][j][n_density+r], var[i][j][0],
			       veclen[j]*sizeof(float32));

		    memcpy(new_mean[i][j][n_density+r], mean[i][j][0],
			   veclen[j]*sizeof(float32));

		    continue;
		}

		/* mixing weight of prior and new densities == 1/2 prior mixing weight */
		new_mixw[i][j][max_wt_idx] /= 2;
		new_mixw[i][j][n_density+r] = new_mixw[i][j][max_wt_idx];

		/* Keep variance of new class same as old */
		if (fullvar)
		    memcpy(new_fullvar[i][j][n_density+r][0], fullvar[i][j][max_wt_idx][0],
			   veclen[j]*veclen[j]*sizeof(float32));
		else
		    memcpy(new_var[i][j][n_density+r], var[i][j][max_wt_idx],
			   veclen[j]*sizeof(float32));

		/* mean_a = mean + 0.2 std */
		/* mean_b = mean - 0.2 std */
		for (l = 0; l < veclen[j]; l++) {
		    /* Use the stddev of mean[l] itself for full covariances. */
		    if (fullvar)
			std = (float32)sqrt(fullvar[i][j][max_wt_idx][l][l]);
		    else
			std = (float32)sqrt(var[i][j][max_wt_idx][l]);
		    
		    new_mean[i][j][max_wt_idx][l] = mean[i][j][max_wt_idx][l] + 0.2f * std;
		    new_mean[i][j][n_density+r][l]  = mean[i][j][max_wt_idx][l] - 0.2f * std;
		}

		did[j][r] = max_wt_idx;
		printf("%u(%.2e)", did[j][r], max_wt);
		fflush(stdout);
	    }
	}
	printf("\n");
    }
	    

    return S3_SUCCESS;
}